

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

GCstr * lj_str_rehash_chain(lua_State *L,StrHash hashc,char *str,MSize len)

{
  uint uVar1;
  global_State *g;
  GCRef *pGVar2;
  GCstr *pGVar3;
  ulong uVar4;
  StrHash h;
  GCstr *pGVar5;
  uint uVar6;
  byte bVar7;
  
  g = (global_State *)(L->glref).ptr64;
  bVar7 = 0;
  if ((g->gc).state == '\x03') {
    bVar7 = (g->gc).currentwhite ^ 3;
  }
  pGVar2 = (g->str).tab;
  uVar1 = (g->str).mask;
  uVar6 = hashc & uVar1;
  pGVar5 = (GCstr *)pGVar2[uVar6].gcptr64;
  pGVar2[uVar6].gcptr64 = 1;
  (g->str).second = '\x01';
  do {
    while( true ) {
      if (pGVar5 == (GCstr *)0x0) {
        pGVar5 = lj_str_new(L,str,(ulong)len);
        return pGVar5;
      }
      pGVar3 = (GCstr *)(pGVar5->nextgc).gcptr64;
      if (bVar7 != 0) break;
LAB_00122815:
      h = pGVar5->hash;
      if (pGVar5->hashalg == '\0') {
        h = hash_dense((g->str).seed,h,(char *)(pGVar5 + 1),pGVar5->len);
        pGVar5->hash = h;
        pGVar5->hashalg = '\x01';
      }
      uVar6 = h & uVar1;
      uVar4 = pGVar2[uVar6].gcptr64;
      (pGVar5->nextgc).gcptr64 = uVar4 & 0xfffffffffffffffe;
      pGVar2[uVar6].gcptr64 = (ulong)((uint)uVar4 & 1) | (ulong)pGVar5;
      pGVar5 = pGVar3;
    }
    if ((bVar7 & (pGVar5->marked ^ 3)) != 0) {
      pGVar5->marked = (g->gc).currentwhite & 3 | pGVar5->marked & 0xf8;
      goto LAB_00122815;
    }
    lj_str_free(g,pGVar5);
    pGVar5 = pGVar3;
  } while( true );
}

Assistant:

static LJ_NOINLINE GCstr *lj_str_rehash_chain(lua_State *L, StrHash hashc,
					      const char *str, MSize len)
{
  global_State *g = G(L);
  int ow = g->gc.state == GCSsweepstring ? otherwhite(g) : 0;  /* Sweeping? */
  GCRef *strtab = g->str.tab;
  MSize strmask = g->str.mask;
  GCobj *o = gcref(strtab[hashc & strmask]);
  setgcrefp(strtab[hashc & strmask], (void *)((uintptr_t)1));
  g->str.second = 1;
  while (o) {
    uintptr_t u;
    GCobj *next = gcnext(o);
    GCstr *s = gco2str(o);
    StrHash hash;
    if (ow) {  /* Must sweep while rechaining. */
      if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* String alive? */
	lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		   "sweep of undead string");
	makewhite(g, o);
      } else {  /* Free dead string. */
	lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		   "sweep of unlive string");
	lj_str_free(g, s);
	o = next;
	continue;
      }
    }
    hash = s->hash;
    if (!s->hashalg) {  /* Rehash with secondary hash. */
      hash = hash_dense(g->str.seed, hash, strdata(s), s->len);
      s->hash = hash;
      s->hashalg = 1;
    }
    /* Rechain. */
    hash &= strmask;
    u = gcrefu(strtab[hash]);
    setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
    setgcrefp(strtab[hash], ((uintptr_t)o | (u & 1)));
    o = next;
  }
  /* Try to insert the pending string again. */
  return lj_str_new(L, str, len);
}